

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O1

void gen_addv_mask(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b,TCGv_i64 m)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  uintptr_t o_3;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i64 a1;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  ts_01 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_andc_i64_tricore(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),a,m);
  tcg_gen_andc_i64_tricore(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),b,m);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_xor_i64,(TCGArg)ts_01,(TCGArg)(a + (long)tcg_ctx),
                      (TCGArg)(b + (long)tcg_ctx));
  a1 = d + (long)tcg_ctx;
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_add_i64,(TCGArg)a1,(TCGArg)ts,(TCGArg)ts_00);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_and_i64,(TCGArg)ts_01,(TCGArg)ts_01,
                      (TCGArg)(m + (long)tcg_ctx));
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_xor_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)ts_01);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  tcg_temp_free_internal_tricore(tcg_ctx,ts_00);
  tcg_temp_free_internal_tricore(tcg_ctx,ts_01);
  return;
}

Assistant:

static void gen_addv_mask(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b, TCGv_i64 m)
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andc_i64(tcg_ctx, t1, a, m);
    tcg_gen_andc_i64(tcg_ctx, t2, b, m);
    tcg_gen_xor_i64(tcg_ctx, t3, a, b);
    tcg_gen_add_i64(tcg_ctx, d, t1, t2);
    tcg_gen_and_i64(tcg_ctx, t3, t3, m);
    tcg_gen_xor_i64(tcg_ctx, d, d, t3);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
}